

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_time(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [4608];
  
  uVar1 = time_info.day + 1;
  pcVar6 = "th";
  if (0xe < time_info.day - 4U) {
    uVar3 = (int)uVar1 % 10 - 1;
    if (uVar3 < 3) {
      pcVar6 = &DAT_003be808 + *(int *)(&DAT_003be808 + (ulong)uVar3 * 4);
    }
  }
  uVar2 = 0xc;
  if ((int)((long)time_info.hour % 0xc) != 0) {
    uVar2 = (long)time_info.hour % 0xc;
  }
  pcVar5 = "";
  if (time_info.half) {
    pcVar5 = "half past ";
  }
  pcVar4 = "am";
  if (0xb < time_info.hour) {
    pcVar4 = "pm";
  }
  sprintf(buf,
          "It is %s%d o\'clock %s, Day %s, %d%s of the Month %s.\n\rIt is the Season %s in the Year %d.\n\r"
          ,pcVar5,uVar2 & 0xffffffff,pcVar4,day_name[(int)uVar1 % 6],(ulong)uVar1,pcVar6,
          month_name[time_info.month],season_name[time_info.season],(ulong)(uint)time_info.year);
  send_to_char(buf,ch);
  pcVar6 = talloc_string(str_boot_time);
  chomp(pcVar6);
  sprintf(buf,"Riftshadow started up at %s.\n\r",pcVar6);
  send_to_char(buf,ch);
  pcVar6 = ctime(&current_time);
  pcVar6 = talloc_string(pcVar6);
  chomp(pcVar6);
  sprintf(buf,"The system time is %s.\n\r",pcVar6);
  send_to_char(buf,ch);
  return;
}

Assistant:

void do_time(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char *suf;

	auto day = time_info.day + 1;

	if (day > 4 && day < 20)
		suf = "th";
	else if (day % 10 == 1)
		suf = "st";
	else if (day % 10 == 2)
		suf = "nd";
	else if (day % 10 == 3)
		suf = "rd";
	else
		suf = "th";

	sprintf(buf, "It is %s%d o'clock %s, Day %s, %d%s of the Month %s.\n\rIt is the Season %s in the Year %d.\n\r",
		(time_info.half) ? "half past " : "",
		(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
		time_info.hour >= 12 ? "pm" : "am",
		day_name[day % 6],
		day,
		suf,
		month_name[time_info.month],
		season_name[time_info.season],
		time_info.year);
	send_to_char(buf, ch);

	auto time = talloc_string(str_boot_time);
	chomp(time);

	sprintf(buf, "Riftshadow started up at %s.\n\r", time);
	send_to_char(buf, ch);

	time = talloc_string(ctime(&current_time));
	chomp(time);

	sprintf(buf, "The system time is %s.\n\r", time);
	send_to_char(buf, ch);
}